

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O0

SUNErrCode SUNContext_ClearErrHandlers(SUNContext sunctx)

{
  long in_RDI;
  SUNContext sunctx_local_scope_;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  SUNErrCode SVar1;
  
  if (in_RDI == 0) {
    SVar1 = -0x26f5;
  }
  else {
    while (*(long *)(in_RDI + 0x20) != 0) {
      SUNContext_PopErrHandler
                ((SUNContext)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
    SVar1 = 0;
  }
  return SVar1;
}

Assistant:

SUNErrCode SUNContext_ClearErrHandlers(SUNContext sunctx)
{
  if (!sunctx) { return SUN_ERR_SUNCTX_CORRUPT; }

  SUNFunctionBegin(sunctx);
  while (sunctx->err_handler != NULL)
  {
    SUNCheckCall(SUNContext_PopErrHandler(sunctx));
  }
  return SUN_SUCCESS;
}